

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

ItemFlags __thiscall QFileSystemModel::flags(QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QFlagsStorage<Qt::ItemFlag> QVar3;
  Type TVar4;
  uint uVar5;
  QFileSystemNode *node;
  
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  QVar3.i = QAbstractItemModel::flags((QModelIndex *)this);
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    if ((index->m).ptr == (QAbstractItemModel *)0x0) {
      node = &this_00->root;
    }
    else {
      node = (QFileSystemNode *)index->i;
    }
    if ((this_00->nameFilterDisables == true) &&
       (bVar2 = QFileSystemModelPrivate::passNameFilters(this_00,node), !bVar2)) {
      return (ItemFlags)(QVar3.i & 0xffffffdf);
    }
    if (node->info == (QExtendedInformation *)0x0) {
      pDVar1 = (node->children).d;
      if (pDVar1 == (Data *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = 0 < (long)pDVar1->size;
      }
    }
    else {
      TVar4 = QExtendedInformation::type(node->info);
      bVar2 = TVar4 == Dir;
    }
    QVar3.i = QVar3.i | (uint)(bVar2 ^ 1) << 7 | 4;
    if (((this_00->readOnly == false) && (index->c == 0)) &&
       ((node->info != (QExtendedInformation *)0x0 &&
        (uVar5 = QFileInfo::permissions(), (uVar5 >> 9 & 1) != 0)))) {
      if (node->info == (QExtendedInformation *)0x0) {
        pDVar1 = (node->children).d;
        if (pDVar1 == (Data *)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = 0 < (long)pDVar1->size;
        }
      }
      else {
        TVar4 = QExtendedInformation::type(node->info);
        bVar2 = TVar4 == Dir;
      }
      QVar3.i = (uint)bVar2 << 3 | QVar3.i | 2;
    }
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar3.i;
}

Assistant:

Qt::ItemFlags QFileSystemModel::flags(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    Qt::ItemFlags flags = QAbstractItemModel::flags(index);
    if (!index.isValid())
        return flags;

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    if (d->nameFilterDisables && !d->passNameFilters(indexNode)) {
        flags &= ~Qt::ItemIsEnabled;
        // ### TODO you shouldn't be able to set this as the current item, task 119433
        return flags;
    }

    flags |= Qt::ItemIsDragEnabled;

    if (!indexNode->isDir())
        flags |= Qt::ItemNeverHasChildren;
    if (d->readOnly)
        return flags;
    if ((index.column() == 0) && indexNode->permissions() & QFile::WriteUser) {
        flags |= Qt::ItemIsEditable;
        if (indexNode->isDir())
            flags |= Qt::ItemIsDropEnabled;
    }
    return flags;
}